

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPEGImageParser.cpp
# Opt level: O1

EStatusCode __thiscall
JPEGImageParser::SkipTillChar
          (JPEGImageParser *this,Byte inSkipUntilValue,unsigned_long *refSkipLimit)

{
  int iVar1;
  undefined4 extraout_var;
  EStatusCode EVar3;
  bool bVar4;
  bool bVar5;
  long lVar2;
  
  if (*refSkipLimit == 0) {
    EVar3 = eSuccess;
  }
  else {
    bVar4 = true;
    bVar5 = true;
    do {
      iVar1 = (*(this->mImageStream->super_IByteReader)._vptr_IByteReader[2])
                        (this->mImageStream,this->mReadBuffer,1);
      lVar2 = CONCAT44(extraout_var,iVar1);
      if (lVar2 == 1) {
        *refSkipLimit = *refSkipLimit - 1;
        bVar5 = bVar4;
        if (this->mReadBuffer[0] == inSkipUntilValue) {
          bVar4 = false;
          bVar5 = false;
        }
      }
    } while (((lVar2 == 1) && (bVar5)) && (*refSkipLimit != 0));
    EVar3 = -(uint)(lVar2 != 1);
  }
  return EVar3;
}

Assistant:

EStatusCode JPEGImageParser::SkipTillChar(IOBasicTypes::Byte inSkipUntilValue,unsigned long& refSkipLimit)
{
	EStatusCode status = PDFHummus::eSuccess;
	bool charNotFound = true;
	
	while(charNotFound && (PDFHummus::eSuccess == status) && (refSkipLimit > 0))
	{
		status = ReadStreamToBuffer(1);
		if(PDFHummus::eSuccess == status)
		{
			--refSkipLimit;
			if(mReadBuffer[0] == inSkipUntilValue)
				charNotFound = false;
		}
	}
	return status;
}